

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

string * tinyformat::format<char[21],std::__cxx11::string,unsigned_int,unsigned_long>
                   (char *fmt,char (*args) [21],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
                   uint *args_2,unsigned_long *args_3)

{
  string *in_RDI;
  ostream *in_R8;
  char *in_R9;
  long in_FS_OFFSET;
  ostringstream oss;
  ostringstream *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  char (*in_stack_fffffffffffffe48) [21];
  ostringstream local_180 [376];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = local_180;
  std::__cxx11::ostringstream::ostringstream(this);
  format<char[21],std::__cxx11::string,unsigned_int,unsigned_long>
            (in_R8,in_R9,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,(uint *)this,
             (unsigned_long *)in_RDI);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_180);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string format(const char* fmt, const Args&... args)
{
    std::ostringstream oss;
    format(oss, fmt, args...);
    return oss.str();
}